

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

Abc_ZddMan * Abc_ZddManAlloc(int nVars,int nObjs)

{
  int iVar1;
  uint uVar2;
  Abc_ZddMan *p;
  int *piVar3;
  Abc_ZddEnt *pAVar4;
  Abc_ZddObj *pAVar5;
  int Var;
  uint uVar6;
  ulong __nmemb;
  
  p = (Abc_ZddMan *)calloc(1,0x60);
  p->nVars = nVars;
  p->nObjsAlloc = nObjs;
  iVar1 = Abc_Base2Log(nObjs);
  uVar6 = -1 << ((byte)iVar1 & 0x1f);
  uVar2 = ~uVar6;
  p->nUniqueMask = uVar2;
  p->nCacheMask = uVar2;
  __nmemb = (ulong)-uVar6;
  piVar3 = (int *)calloc(__nmemb,4);
  p->pUnique = piVar3;
  piVar3 = (int *)calloc((long)nObjs,4);
  p->pNexts = piVar3;
  pAVar4 = (Abc_ZddEnt *)calloc(__nmemb,0x10);
  p->pCache = pAVar4;
  pAVar5 = (Abc_ZddObj *)calloc((long)nObjs,0xc);
  p->pObjs = pAVar5;
  p->nObjs = 2;
  pAVar5[1].False = 0xffffffff;
  pAVar5->True = 0xffffffff;
  pAVar5->False = 0xffffffff;
  *(undefined4 *)(pAVar5 + 1) = 0xffffffff;
  pAVar5[1].True = 0xffffffff;
  *(uint *)pAVar5 = nVars | 0x80000000U;
  *(uint *)(pAVar5 + 1) = nVars | 0x80000000U;
  Var = 0;
  iVar1 = 0;
  if (0 < nVars) {
    iVar1 = nVars;
  }
  for (; iVar1 != Var; Var = Var + 1) {
    Abc_ZddUniqueCreate(p,Var,1,0);
  }
  if (p->nObjs != nVars + 2) {
    __assert_fail("p->nObjs == nVars + 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                  ,0xca,"Abc_ZddMan *Abc_ZddManAlloc(int, int)");
  }
  p->nMemory = ((ulong)((long)p->nObjsAlloc * 0xc) >> 2) +
               (ulong)p->nUniqueMask + (long)p->nObjsAlloc + (ulong)(p->nCacheMask + 1) * 4 + 0x19;
  return p;
}

Assistant:

Abc_ZddMan * Abc_ZddManAlloc( int nVars, int nObjs )
{
    Abc_ZddMan * p; int i;
    p = ABC_CALLOC( Abc_ZddMan, 1 );
    p->nVars       = nVars;
    p->nObjsAlloc  = nObjs;
    p->nUniqueMask = (1 << Abc_Base2Log(nObjs)) - 1;
    p->nCacheMask  = (1 << Abc_Base2Log(nObjs)) - 1;
    p->pUnique     = ABC_CALLOC( int, p->nUniqueMask + 1 );
    p->pNexts      = ABC_CALLOC( int, p->nObjsAlloc );
    p->pCache      = ABC_CALLOC( Abc_ZddEnt, p->nCacheMask + 1 );
    p->pObjs       = ABC_CALLOC( Abc_ZddObj, p->nObjsAlloc );
    p->nObjs       = 2;
    memset( p->pObjs, 0xff, sizeof(Abc_ZddObj) * 2 );
    p->pObjs[0].Var = nVars;
    p->pObjs[1].Var = nVars;
    for ( i = 0; i < nVars; i++ )
        Abc_ZddUniqueCreate( p, i, 1, 0 );
    assert( p->nObjs == nVars + 2 );
    p->nMemory = sizeof(Abc_ZddMan)/4 + 
        p->nUniqueMask + 1 + p->nObjsAlloc + 
        (p->nCacheMask + 1) * sizeof(Abc_ZddEnt)/4 + 
        p->nObjsAlloc * sizeof(Abc_ZddObj)/4;
    return p;
}